

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::Update(BoardView *this)

{
  BackgroundImage *this_00;
  KeyBindings *this_01;
  bool *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BRDFileBase *pBVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Component *this_03;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  ImVec2 IVar7;
  double dVar8;
  undefined1 auVar9 [16];
  _Impl *p_Var10;
  _Impl *p_Var11;
  bool bVar12;
  int iVar13;
  ImGuiIO *this_04;
  undefined8 extraout_RAX;
  char *label;
  undefined7 extraout_var;
  ImGuiIO *pIVar14;
  ImDrawList *draw;
  uint uVar15;
  long lVar16;
  char (*s) [2048];
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  path filepath;
  char *preset_filename;
  undefined1 local_c8 [8];
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Impl *local_a8;
  undefined1 local_a0 [32];
  _Impl *local_80;
  undefined1 local_78 [4];
  undefined1 auStack_74 [12];
  string local_60;
  char (*local_40) [2048];
  ImGuiIO *local_38;
  
  local_40 = (char (*) [2048])0x0;
  this_04 = ImGui::GetIO();
  if ((this_04->DisplaySize).x <= 0.0) {
    return;
  }
  if ((this_04->DisplaySize).y <= 0.0) {
    return;
  }
  local_c8 = (undefined1  [8])&local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Open","");
  this_01 = &this->keybindings;
  bVar12 = KeyBindings::isPressed(this_01,(string *)local_c8);
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
  }
  if (bVar12) {
    ImGuiIO::AddKeyEvent(this_04,ImGuiKey_RightCtrl,false);
    ImGuiIO::AddKeyEvent(this_04,ImGuiKey_LeftCtrl,false);
    ImGuiIO::AddKeyEvent(this_04,ImGuiKey_O,false);
    local_78 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = auStack_74;
    _local_78 = auVar9 << 0x20;
  }
  local_c8 = (undefined1  [8])&local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Quit","");
  bVar12 = KeyBindings::isPressed(this_01,(string *)local_c8);
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
  }
  if (bVar12) {
    this->m_wantsQuit = true;
  }
  bVar12 = ImGui::BeginMainMenuBar();
  if (bVar12) {
    fVar17 = ImGui::GetWindowHeight();
    this->m_menu_height = fVar17;
    SearchComponent(this);
    ContextMenu(this);
    bVar12 = ImGui::BeginMenu("File",true);
    if (bVar12) {
      local_a0._0_8_ = (long)local_a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Open","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Open",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (local_a0._0_8_ != (long)local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      uVar15 = 1;
      if (!bVar12) {
        uVar15 = (uint)local_78[0];
      }
      local_78 = (undefined1  [4])uVar15;
      ImGui::Separator();
      if (0 < (this->fhistory).count) {
        s = (this->fhistory).history;
        lVar16 = 0;
        do {
          label = FHistory::Trim_filename(&this->fhistory,*s,2);
          bVar12 = ImGui::MenuItem(label,(char *)0x0,false,true);
          if (bVar12) {
            local_78 = (undefined1  [4])(int)CONCAT71(extraout_var,1);
            local_40 = s;
          }
          lVar16 = lVar16 + 1;
          s = s + 1;
        } while (lVar16 < (this->fhistory).count);
      }
      ImGui::Separator();
      local_a0._0_8_ = (long)local_a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Search","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Part/Net Search",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (local_a0._0_8_ != (long)local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if ((bVar12) && (this->m_validBoard == true)) {
        this->m_showSearch = true;
      }
      ImGui::Separator();
      Preferences::Program::menuItem(&this->programPreferences);
      Preferences::Color::menuItem(&this->colorPreferences);
      Preferences::Keyboard::menuItem(&this->keyboardPreferences);
      Preferences::BoardSettings::menuItem(&this->boardSettings);
      ImGui::Separator();
      local_a0._0_8_ = (long)local_a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Quit","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Quit",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (local_a0._0_8_ != (long)local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (bVar12) {
        this->m_wantsQuit = true;
      }
      ImGui::EndMenu();
    }
    bVar12 = ImGui::BeginMenu("View",true);
    if (bVar12) {
      IVar7 = (ImVec2)((long)local_a0 + 0x10);
      local_a0._0_8_ = IVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Flip","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Flip board",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (bVar12) {
        FlipBoard(this,0);
      }
      local_a0._0_8_ = IVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"RotateCW","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Rotate CW",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (bVar12) {
        Rotate(this,1);
      }
      local_a0._0_8_ = IVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"RotateCCW","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Rotate CCW",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (bVar12) {
        Rotate(this,-1);
      }
      local_a0._0_8_ = IVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Center","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Reset View",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (bVar12) {
        CenterView(this);
      }
      local_a0._0_8_ = IVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Mirror","");
      KeyBindings::getKeyNames((string *)local_c8,this_01,(string *)local_a0);
      bVar12 = ImGui::MenuItem("Mirror Board",(char *)local_c8,false,true);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (bVar12) {
        Mirror(this);
      }
      ImGui::Separator();
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show FPS","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showFPS,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showFPS",(this->config).showFPS);
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show position","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showPosition,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPosition",(this->config).showPosition);
      }
      local_c8 = (undefined1  [8])&local_b8;
      local_38 = this_04;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show pins","");
      paVar1 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"TogglePins","");
      KeyBindings::getKeyNames((string *)local_a0,this_01,&local_60);
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showPins,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPins",(this->config).showPins);
        this->m_needsRedraw = true;
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show net web","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showNetWeb,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showNetWeb",(this->config).showNetWeb);
        this->m_needsRedraw = true;
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show annotations","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showAnnotations,true
                         );
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showAnnotations",(this->config).showAnnotations);
        this->m_needsRedraw = true;
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show parts name","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showPartName,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPartName",(this->config).showPartName);
        this->m_needsRedraw = true;
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show pins name","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showPinName,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPinName",(this->config).showPinName);
        this->m_needsRedraw = true;
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Show background image","")
      ;
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showBackgroundImage,
                          true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool
                  (&this->obvconfig,"showBackgroundImage",(this->config).showBackgroundImage);
        (this->backgroundImage).enabled = (this->config).showBackgroundImage;
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Fill board","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).boardFill,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"boardFill",(this->config).boardFill);
        this->m_needsRedraw = true;
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Fill parts","");
      local_a0._8_8_ = 0;
      local_a0[0x10] = '\0';
      local_a0._0_8_ = IVar7;
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).fillParts,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"fillParts",(this->config).fillParts);
        this->m_needsRedraw = true;
      }
      ImGui::Separator();
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Info Panel","");
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"InfoPanel","");
      KeyBindings::getKeyNames((string *)local_a0,this_01,&local_60);
      bVar12 = MenuItemWithCheckbox
                         ((string *)local_c8,(string *)local_a0,&(this->config).showInfoPanel,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showInfoPanel",(this->config).showInfoPanel);
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Net List","");
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"NetList","");
      KeyBindings::getKeyNames((string *)local_a0,this_01,&local_60);
      MenuItemWithCheckbox((string *)local_c8,(string *)local_a0,&this->m_showNetList,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Part List","");
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"PartList","");
      KeyBindings::getKeyNames((string *)local_a0,this_01,&local_60);
      MenuItemWithCheckbox((string *)local_c8,(string *)local_a0,&this->m_showPartList,true);
      if ((ImVec2)local_a0._0_8_ != IVar7) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      this_04 = local_38;
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      ImGui::EndMenu();
    }
    bVar12 = ImGui::BeginMenu("Help##1",true);
    if (bVar12) {
      Help::Controls::menuItem(&this->helpControls);
      Help::About::menuItem(&this->helpAbout);
      ImGui::EndMenu();
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(10);
    local_c8._4_4_ = 1.0;
    local_c8._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)local_c8);
    ImGui::SameLine(0.0,-1.0);
    v = &(this->config).showAnnotations;
    bVar12 = ImGui::Checkbox("Annotations",v);
    if (bVar12) {
      Confparse::WriteBool(&this->obvconfig,"showAnnotations",(this->config).showAnnotations);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar12 = ImGui::Checkbox("Netweb",&(this->config).showNetWeb);
    if (bVar12) {
      Confparse::WriteBool(&this->obvconfig,"showNetWeb",(this->config).showNetWeb);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar12 = ImGui::Checkbox("Pins",&(this->config).showPins);
    if (bVar12) {
      Confparse::WriteBool(&this->obvconfig,"showPins",(this->config).showPins);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar12 = ImGui::Checkbox("Image",&(this->config).showBackgroundImage);
    if (bVar12) {
      Confparse::WriteBool
                (&this->obvconfig,"showBackgroundImage",(this->config).showBackgroundImage);
      (this->backgroundImage).enabled = (this->config).showBackgroundImage;
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(0x28);
    local_c8._4_4_ = 1.0;
    local_c8._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)local_c8);
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button(" - ",(ImVec2 *)local_c8);
    if (bVar12) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           -(this->config).zoomFactor);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button(" + ",(ImVec2 *)local_c8);
    if (bVar12) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           (this->config).zoomFactor);
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(0x14);
    local_c8._4_4_ = 1.0;
    local_c8._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)local_c8);
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button("-",(ImVec2 *)local_c8);
    if (bVar12) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           -(this->config).zoomFactor / (float)(this->config).zoomModifier);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button("+",(ImVec2 *)local_c8);
    if (bVar12) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           (this->config).zoomFactor / (float)(this->config).zoomModifier);
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(0x14);
    local_c8._4_4_ = 1.0;
    local_c8._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)local_c8);
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button(" < ",(ImVec2 *)local_c8);
    if (bVar12) {
      Rotate(this,-1);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button(" ^ ",(ImVec2 *)local_c8);
    if (bVar12) {
      FlipBoard(this,0);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button(" > ",(ImVec2 *)local_c8);
    if (bVar12) {
      Rotate(this,1);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button("X",(ImVec2 *)local_c8);
    if (bVar12) {
      CenterView(this);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    bVar12 = ImGui::Button("CLEAR",(ImVec2 *)local_c8);
    if (bVar12) {
      ClearAllHighlights(this);
    }
    if (((this->m_showContextMenu == true) && (this->m_file != (BRDFileBase *)0x0)) && (*v == true))
    {
      ImGui::OpenPopup("Annotations",0);
    }
    Help::About::render(&this->helpAbout);
    Help::Controls::render(&this->helpControls);
    Preferences::Program::render(&this->programPreferences);
    bVar12 = Preferences::Color::render(&this->colorPreferences);
    if (bVar12) {
      this->m_needsRedraw = true;
    }
    Preferences::Keyboard::render(&this->keyboardPreferences);
    Preferences::BoardSettings::render(&this->boardSettings);
    if ((this->m_showSearch == true) && (this->m_file != (BRDFileBase *)0x0)) {
      ImGui::OpenPopup("Search for Component / Network",0);
    }
    bVar12 = ImGui::BeginPopupModal("Error opening file",(bool *)0x0,0);
    if (bVar12) {
      ImGui::Text("There was an error opening the file: %s",
                  (this->m_lastFileOpenName)._M_dataplus._M_p);
      if ((this->m_error_msg)._M_string_length != 0) {
        ImGui::Text("%s",(this->m_error_msg)._M_dataplus._M_p);
      }
      pBVar2 = this->m_file;
      if ((pBVar2 != (BRDFileBase *)0x0) && ((pBVar2->error_msg)._M_string_length != 0)) {
        ImGui::Text("%s",(pBVar2->error_msg)._M_dataplus._M_p);
      }
      local_c8._0_4_ = 0.0;
      local_c8._4_4_ = 0.0;
      bVar12 = ImGui::Button("OK",(ImVec2 *)local_c8);
      if (bVar12) {
        ImGui::CloseCurrentPopup();
      }
      ImGui::EndPopup();
    }
    if (this->m_lastFileOpenWasInvalid == true) {
      ImGui::OpenPopup("Error opening file",0);
      this->m_lastFileOpenWasInvalid = false;
    }
    ImGui::EndMainMenuBar();
  }
  if ((_local_78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::filesystem::__cxx11::path::path((path *)local_c8);
    if (local_40 == (char (*) [2048])0x0) {
      show_file_picker_abi_cxx11_((path *)local_a0,true);
      std::filesystem::__cxx11::path::operator=((path *)local_c8,(path *)local_a0);
      std::filesystem::__cxx11::path::~path((path *)local_a0);
      pIVar14 = ImGui::GetIO();
      pIVar14->MouseDown[0] = false;
      pIVar14->MouseClicked[0] = false;
      pIVar14->MouseClickedPos[0].x = 0.0;
      pIVar14->MouseClickedPos[0].y = 0.0;
    }
    else {
      std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                ((path *)local_a0,(char **)&local_40,auto_format);
      std::__cxx11::string::operator=((string *)local_c8,(string *)local_a0);
      p_Var11 = local_80;
      p_Var10 = local_a8;
      local_80 = (_Impl *)0x0;
      local_a8 = p_Var11;
      if (p_Var10 != (_Impl *)0x0) {
        std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                  ((_Impl_deleter *)&local_a8,p_Var10);
      }
      std::filesystem::__cxx11::path::clear((path *)local_a0);
      std::filesystem::__cxx11::path::~path((path *)local_a0);
      local_40 = (char (*) [2048])0x0;
    }
    if (local_c0 != 0) {
      LoadFile(this,(path *)local_c8);
    }
    std::filesystem::__cxx11::path::~path((path *)local_c8);
  }
  fVar17 = DPIF(10.0);
  local_78 = (undefined1  [4])fVar17;
  fVar17 = ImGui::GetFontSize();
  this->m_status_height = fVar17 + (float)local_78;
  local_78 = (undefined1  [4])DPIF(4.0);
  local_c8._4_4_ = DPIF(3.0);
  local_c8._0_4_ = local_78;
  ImGui::PushStyleVar(2,(ImVec2 *)local_c8);
  ImGui::PushStyleVar(3,0.0);
  ImGui::PushStyleVar(4,1.0);
  local_c8 = (undefined1  [8])
             ((ulong)(uint)((this_04->DisplaySize).y - this->m_status_height) << 0x20);
  local_a0._0_4_ = 0.0;
  local_a0._4_4_ = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_c8,0,(ImVec2 *)local_a0);
  local_c8._4_4_ = this->m_status_height;
  local_c8._0_4_ = (this_04->DisplaySize).x;
  ImGui::SetNextWindowSize((ImVec2 *)local_c8,0);
  ImGui::Begin("status",(bool *)0x0,0x112f);
  if (((this->m_file == (BRDFileBase *)0x0) || (this->m_board == (Board *)0x0)) ||
     (peVar3 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar3 == (element_type *)0x0)) {
    IVar7 = ImGui::GetMousePos();
    IVar7 = ScreenToCoord(this,IVar7.x,IVar7.y,1.0);
    unique0x10000a59 = extraout_XMM0_Dc;
    local_78 = (undefined1  [4])IVar7.x;
    auStack_74._0_4_ = IVar7.y;
    unique0x10000a5d = extraout_XMM0_Dd;
    if ((this->config).showFPS == true) {
      pIVar14 = ImGui::GetIO();
      ImGui::Text("FPS: %0.0f ",SUB84((double)pIVar14->Framerate,0));
      ImGui::SameLine(0.0,-1.0);
    }
    if (this->debug == true) {
      ImGui::Text("AnnID:%d ");
      ImGui::SameLine(0.0,-1.0);
    }
    if ((this->config).showPosition == true) {
      ImGui::Text("Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)",
                  SUB84((double)((float)local_78 / 1000.0),0),
                  (double)((float)auStack_74._0_4_ / 1000.0),(double)(float)local_78 * 0.0254,
                  (double)(float)auStack_74._0_4_ * 0.0254);
      ImGui::SameLine(0.0,-1.0);
    }
    if (this->m_validBoard == true) {
      IVar7 = ImGui::CalcTextSize((this->fhistory).history[0],(char *)0x0,false,-1.0);
      unique0x10000a7d = extraout_XMM0_Dc_00;
      local_78 = (undefined1  [4])IVar7.x;
      auStack_74._0_4_ = IVar7.y;
      unique0x10000a81 = extraout_XMM0_Dd_00;
      fVar17 = ImGui::GetWindowWidth();
      ImGui::SameLine((fVar17 - (float)local_78) + -20.0,-1.0);
      ImGui::Text("%s");
      ImGui::SameLine(0.0,-1.0);
    }
    ImGui::Text(" ");
  }
  else {
    this_02 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
    }
    this_03 = (peVar3->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar4 = (this_03->name)._M_dataplus._M_p;
    pcVar5 = (peVar3->name)._M_dataplus._M_p;
    pcVar6 = (peVar3->net->name)._M_dataplus._M_p;
    uVar15 = *(uint *)&(peVar3->net->super_BoardElement).field_0xc;
    local_38 = this_04;
    Component::mount_type_str_abi_cxx11_((string *)local_c8,this_03);
    ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",pcVar4,pcVar5,pcVar6,
                (ulong)uVar15,local_c8);
    this_04 = local_38;
    if (local_c8 != (undefined1  [8])&local_b8) {
      operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
    }
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
  }
  ImGui::End();
  ImGui::PopStyleVar(1);
  ImGui::PopStyleVar(1);
  ImGui::PopStyleVar(1);
  if ((this->config).showInfoPanel == false) {
    fVar17 = (this_04->DisplaySize).y - (this->m_status_height + this->m_menu_height);
    (this->m_board_surface).x = (this_04->DisplaySize).x;
  }
  else {
    fVar17 = (this_04->DisplaySize).y - (this->m_status_height + this->m_menu_height);
    (this->m_board_surface).x = (this_04->DisplaySize).x - (this->m_info_surface).x;
  }
  (this->m_board_surface).y = fVar17;
  local_c8 = (undefined1  [8])((ulong)(uint)this->m_menu_height << 0x20);
  local_a0._0_4_ = 0.0;
  local_a0._4_4_ = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_c8,0,(ImVec2 *)local_a0);
  fVar17 = (this_04->DisplaySize).x;
  if ((fVar17 == this->m_lastWidth) && (!NAN(fVar17) && !NAN(this->m_lastWidth))) {
    fVar17 = (this_04->DisplaySize).y;
    if ((fVar17 == this->m_lastHeight) && (!NAN(fVar17) && !NAN(this->m_lastHeight)))
    goto LAB_0011850a;
  }
  fVar17 = (this->m_board_surface).y;
  this->m_lastWidth = (this->m_board_surface).x;
  this->m_lastHeight = fVar17;
  this->m_needsRedraw = true;
LAB_0011850a:
  ImGui::SetNextWindowSize(&this->m_board_surface,0);
  ImGui::PushStyleVar(3,0.0);
  ImGui::PushStyleVar(4,1.0);
  ImGui::PushStyleColor(2,(this->m_colors).backgroundColor);
  ImGui::Begin("surface",(bool *)0x0,0x1313f);
  if (this->m_validBoard == true) {
    HandleInput(this);
    this_00 = &this->backgroundImage;
    draw = ImGui::GetWindowDrawList();
    fVar17 = BackgroundImage::x0(this_00);
    local_78 = (undefined1  [4])fVar17;
    dVar8 = BackgroundImage::y0(this_00,(double)CONCAT44(extraout_XMM0_Db,fVar17));
    local_c8 = (undefined1  [8])CoordToScreen(this,(float)local_78,SUB84(dVar8,0),1.0);
    local_78 = (undefined1  [4])BackgroundImage::x1(this_00);
    dVar8 = BackgroundImage::y1(this_00,(double)CONCAT44(extraout_XMM0_Db_00,local_78));
    local_a0._0_8_ = CoordToScreen(this,(float)local_78,SUB84(dVar8,0),1.0);
    BackgroundImage::render(this_00,draw,(ImVec2 *)local_c8,(ImVec2 *)local_a0,this->m_rotation);
    DrawBoard(this);
  }
  ImGui::End();
  ImGui::PopStyleColor(1);
  ImGui::PopStyleVar(1);
  RenderOverlay(this);
  ImGui::PopStyleVar(1);
  HandlePDFBridgeSelection(this);
  return;
}

Assistant:

void BoardView::Update() {
	bool open_file = false;
	// ImGuiIO &io = ImGui::GetIO();
	char *preset_filename = NULL;
	ImGuiIO &io           = ImGui::GetIO();

	// Window is probably minimized, do not attempt to draw anything as our code will not handle screen size of 0 properly and crash (ocornut/imgui@bb2529d)
	if (io.DisplaySize.x <= 0.0f || io.DisplaySize.y <= 0.0f) {
		return;
	}

	/**
	 * ** FIXME
	 * This should be handled in the keyboard section, not here
	 */
	if (keybindings.isPressed("Open")) {
		open_file = true;
		// the dialog will likely eat our WM_KEYUP message for CTRL and O:
		io.AddKeyEvent(ImGuiKey_RightCtrl, false);
		io.AddKeyEvent(ImGuiKey_LeftCtrl, false);
		io.AddKeyEvent(ImGuiKey_O, false);

	}

	if (keybindings.isPressed("Quit")) {
		m_wantsQuit = true;
	}

	if (ImGui::BeginMainMenuBar()) {
		m_menu_height = ImGui::GetWindowHeight();

		/*
		 * Create these dialogs, but they're not actually
		 * visible until they're called up by the respective
		 * flags.
		 */
		SearchComponent();
		ContextMenu();

		if (ImGui::BeginMenu("File")) {
			if (ImGui::MenuItem("Open", keybindings.getKeyNames("Open").c_str())) {
				open_file = true;
			}

			/// Generate file history - PLD20160618-2028
			ImGui::Separator();
			{
				int i;
				for (i = 0; i < fhistory.count; i++) {
					if (ImGui::MenuItem(fhistory.Trim_filename(fhistory.history[i], 2))) {
						open_file       = true;
						preset_filename = fhistory.history[i];
					}
				}
			}
			ImGui::Separator();

			if (ImGui::MenuItem("Part/Net Search", keybindings.getKeyNames("Search").c_str())) {
				if (m_validBoard) m_showSearch = true;
			}

			ImGui::Separator();

			programPreferences.menuItem();
			colorPreferences.menuItem();
			keyboardPreferences.menuItem();
			boardSettings.menuItem();

			ImGui::Separator();

			if (ImGui::MenuItem("Quit", keybindings.getKeyNames("Quit").c_str())) {
				m_wantsQuit = true;
			}
			ImGui::EndMenu();
		}
		if (ImGui::BeginMenu("View")) {
			if (ImGui::MenuItem("Flip board", keybindings.getKeyNames("Flip").c_str())) {
				FlipBoard();
			}
			if (ImGui::MenuItem("Rotate CW", keybindings.getKeyNames("RotateCW").c_str())) {
				Rotate(1);
			}
			if (ImGui::MenuItem("Rotate CCW", keybindings.getKeyNames("RotateCCW").c_str())) {
				Rotate(-1);
			}
			if (ImGui::MenuItem("Reset View", keybindings.getKeyNames("Center").c_str())) {
				CenterView();
			}
			if (ImGui::MenuItem("Mirror Board", keybindings.getKeyNames("Mirror").c_str())) {
				Mirror();
			}

			ImGui::Separator();
			if (MenuItemWithCheckbox("Show FPS", {}, config.showFPS)) {
				obvconfig.WriteBool("showFPS", config.showFPS);
			}

			if (MenuItemWithCheckbox("Show position", {}, config.showPosition)) {
				obvconfig.WriteBool("showPosition", config.showPosition);
			}

			if (MenuItemWithCheckbox("Show pins", keybindings.getKeyNames("TogglePins"), config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show net web", {}, config.showNetWeb)) {
				obvconfig.WriteBool("showNetWeb", config.showNetWeb);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show annotations", {}, config.showAnnotations)) {
				obvconfig.WriteBool("showAnnotations", config.showAnnotations);
				m_needsRedraw = true;
			}


			if (MenuItemWithCheckbox("Show parts name", {}, config.showPartName)) {
				obvconfig.WriteBool("showPartName", config.showPartName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show pins name", {}, config.showPinName)) {
				obvconfig.WriteBool("showPinName", config.showPinName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show background image", {}, config.showBackgroundImage)) {
				obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
				backgroundImage.enabled = config.showBackgroundImage;
			}

			if (MenuItemWithCheckbox("Fill board", {}, config.boardFill)) {
				obvconfig.WriteBool("boardFill", config.boardFill);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Fill parts", {}, config.fillParts)) {
				obvconfig.WriteBool("fillParts", config.fillParts);
				m_needsRedraw = true;
			}

			ImGui::Separator();

			if (MenuItemWithCheckbox("Info Panel", keybindings.getKeyNames("InfoPanel"), config.showInfoPanel)) {
				obvconfig.WriteBool("showInfoPanel", config.showInfoPanel);
			}
			MenuItemWithCheckbox("Net List", keybindings.getKeyNames("NetList"), m_showNetList);
			MenuItemWithCheckbox("Part List", keybindings.getKeyNames("PartList"), m_showPartList);

			ImGui::EndMenu();
		}

		if (ImGui::BeginMenu("Help##1")) {
			helpControls.menuItem();
			helpAbout.menuItem();

			ImGui::EndMenu();
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(10), 1));
		ImGui::SameLine();
		if (ImGui::Checkbox("Annotations", &config.showAnnotations)) {
			obvconfig.WriteBool("showAnnotations", config.showAnnotations);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Netweb", &config.showNetWeb)) {
			obvconfig.WriteBool("showNetWeb", config.showNetWeb);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		{
			if (ImGui::Checkbox("Pins", &config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Image", &config.showBackgroundImage)) {
			obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
			backgroundImage.enabled = config.showBackgroundImage;
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(40), 1));

		ImGui::SameLine();
		if (ImGui::Button(" - ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);
		}
		ImGui::SameLine();
		if (ImGui::Button(" + ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);
		}
		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button("-")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor / config.zoomModifier);
		}
		ImGui::SameLine();
		if (ImGui::Button("+")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor / config.zoomModifier);
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button(" < ")) {
			Rotate(-1);
		}

		ImGui::SameLine();
		if (ImGui::Button(" ^ ")) {
			FlipBoard();
		}

		ImGui::SameLine();
		if (ImGui::Button(" > ")) {
			Rotate(1);
		}

		ImGui::SameLine();
		if (ImGui::Button("X")) {
			CenterView();
		}

		ImGui::SameLine();
		if (ImGui::Button("CLEAR")) {
			ClearAllHighlights();
		}

		/*
		ImGui::SameLine();
		ImVec2 tz = ImGui::CalcTextSize("Search             ");
		ImGui::PushItemWidth(-tz.x);
		ImGui::Text("Search");
		ImGui::SameLine();
		ImGui::PushItemWidth(-DPI(1));
		if (ImGui::InputText("##ansearch", m_search, 128, 0)) {
		}
		ImGui::PopItemWidth();
		*/

		if (m_showContextMenu && m_file && config.showAnnotations) {
			ImGui::OpenPopup("Annotations");
		}

		helpAbout.render();
		helpControls.render();

		programPreferences.render();

		if (colorPreferences.render()) {
			m_needsRedraw = true;
		};

		keyboardPreferences.render();
		boardSettings.render();

		if (m_showSearch && m_file) {
			ImGui::OpenPopup("Search for Component / Network");
		}

		if (ImGui::BeginPopupModal("Error opening file")) {
			ImGui::Text("There was an error opening the file: %s", m_lastFileOpenName.c_str());
			if (!m_error_msg.empty()) {
				ImGui::Text("%s", m_error_msg.c_str());
			}
			if (m_file && !m_file->error_msg.empty()) {
				ImGui::Text("%s", m_file->error_msg.c_str());
			}
			if (ImGui::Button("OK")) {
				ImGui::CloseCurrentPopup();
			}
			ImGui::EndPopup();
		}
		if (m_lastFileOpenWasInvalid) {
			ImGui::OpenPopup("Error opening file");
			m_lastFileOpenWasInvalid = false;
		}
		ImGui::EndMainMenuBar();
	}

	if (open_file) {
		filesystem::path filepath;

		if (preset_filename) {
			filepath        = filesystem::u8path(preset_filename);
			preset_filename = NULL;
		} else {
			filepath = show_file_picker(true);

			ImGuiIO &io           = ImGui::GetIO();
			io.MouseDown[0]       = false;
			io.MouseClicked[0]    = false;
			io.MouseClickedPos[0] = ImVec2(0, 0);
		}

		if (!filepath.empty()) {
			LoadFile(filepath);
		}
	}

	ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove |
	                         ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;

	// ImGui's keyboard navigation is disabled for the boardview area as we use our own key bindings
	ImGuiWindowFlags draw_surface_flags = flags | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoBringToFrontOnFocus |
		ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_NoNavInputs;

	/*
	 * Status footer
	 */
	m_status_height = (DPIF(10.0f) + ImGui::GetFontSize());
	ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(DPIF(4.0f), DPIF(3.0f)));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::SetNextWindowPos(ImVec2(0, io.DisplaySize.y - m_status_height));
	ImGui::SetNextWindowSize(ImVec2(io.DisplaySize.x, m_status_height));
	ImGui::Begin("status", nullptr, flags | ImGuiWindowFlags_NoFocusOnAppearing);
	if (m_file && m_board && m_pinSelected) {
		auto pin = m_pinSelected;
		ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",
		            pin->component->name.c_str(),
		            pin->name.c_str(),
		            pin->net->name.c_str(),
		            pin->net->number,
		            pin->component->mount_type_str().c_str());
	} else {
		ImVec2 spos = ImGui::GetMousePos();
		ImVec2 pos  = ScreenToCoord(spos.x, spos.y);
		if (config.showFPS == true) {
			ImGui::Text("FPS: %0.0f ", ImGui::GetIO().Framerate);
			ImGui::SameLine();
		}

		if (debug) {
			ImGui::Text("AnnID:%d ", m_annotation_clicked_id);
			ImGui::SameLine();
		}

		if (config.showPosition == true) {
			ImGui::Text("Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)", pos.x / 1000, pos.y / 1000, pos.x * 0.0254, pos.y * 0.0254);
			ImGui::SameLine();
		}

		{
			if (m_validBoard) {
				ImVec2 s = ImGui::CalcTextSize(fhistory.history[0]);
				ImGui::SameLine(ImGui::GetWindowWidth() - s.x - 20);
				ImGui::Text("%s", fhistory.history[0]);
				ImGui::SameLine();
			}
		}
		ImGui::Text(" ");
	}
	ImGui::End();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();

	if (!config.showInfoPanel) {
		m_board_surface = ImVec2(io.DisplaySize.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	} else {
		m_board_surface = ImVec2(io.DisplaySize.x - m_info_surface.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	}
	/*
	 * Drawing surface, where the actual PCB/board is plotted out
	 */
	ImGui::SetNextWindowPos(ImVec2(0, m_menu_height));
	if (io.DisplaySize.x != m_lastWidth || io.DisplaySize.y != m_lastHeight) {
		//		m_lastWidth   = io.DisplaySize.x;
		//		m_lastHeight  = io.DisplaySize.y;
		m_lastWidth   = m_board_surface.x;
		m_lastHeight  = m_board_surface.y;
		m_needsRedraw = true;
	}

	ImGui::SetNextWindowSize(m_board_surface);

	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::PushStyleColor(ImGuiCol_WindowBg, m_colors.backgroundColor);

	ImGui::Begin("surface", nullptr, draw_surface_flags);
	if (m_validBoard) {
		HandleInput();
		backgroundImage.render(*ImGui::GetWindowDrawList(),
			CoordToScreen(backgroundImage.x0(), backgroundImage.y0()),
			CoordToScreen(backgroundImage.x1(), backgroundImage.y1()),
			m_rotation);
		DrawBoard();
	}
	ImGui::End();
	ImGui::PopStyleColor();
	ImGui::PopStyleVar();

	// Overlay
	RenderOverlay();

	ImGui::PopStyleVar();

	HandlePDFBridgeSelection();

}